

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum10.h
# Opt level: O2

void __thiscall
CScriptNum10::CScriptNum10
          (CScriptNum10 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vch,
          bool fRequireMinimal,size_t nMaxNumSize)

{
  pointer puVar1;
  pointer puVar2;
  int64_t iVar3;
  scriptnum10_error *psVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  allocator<char> local_41;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)puVar2 - (long)puVar1;
  if (nMaxNumSize < uVar5) {
    psVar4 = (scriptnum10_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"script number overflow",&local_41);
    scriptnum10_error::scriptnum10_error(psVar4,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(psVar4,&scriptnum10_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (((fRequireMinimal && puVar2 != puVar1) && ((puVar2[-1] & 0x7f) == 0)) &&
          ((uVar5 < 2 || (-1 < (char)puVar1[uVar5 - 2])))) {
    psVar4 = (scriptnum10_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"non-minimally encoded script number",&local_41);
    scriptnum10_error::scriptnum10_error(psVar4,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(psVar4,&scriptnum10_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    iVar3 = set_vch(vch);
    this->m_value = iVar3;
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CScriptNum10(const std::vector<unsigned char>& vch, bool fRequireMinimal,
                        const size_t nMaxNumSize = nDefaultMaxNumSize)
    {
        if (vch.size() > nMaxNumSize) {
            throw scriptnum10_error("script number overflow");
        }
        if (fRequireMinimal && vch.size() > 0) {
            // Check that the number is encoded with the minimum possible
            // number of bytes.
            //
            // If the most-significant-byte - excluding the sign bit - is zero
            // then we're not minimal. Note how this test also rejects the
            // negative-zero encoding, 0x80.
            if ((vch.back() & 0x7f) == 0) {
                // One exception: if there's more than one byte and the most
                // significant bit of the second-most-significant-byte is set
                // it would conflict with the sign bit. An example of this case
                // is +-255, which encode to 0xff00 and 0xff80 respectively.
                // (big-endian).
                if (vch.size() <= 1 || (vch[vch.size() - 2] & 0x80) == 0) {
                    throw scriptnum10_error("non-minimally encoded script number");
                }
            }
        }
        m_value = set_vch(vch);
    }